

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
 mp::internal::ExprBase::
 Create<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
           (Impl *impl)

{
  bool bVar1;
  Kind k;
  char *message;
  BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45> in_RDI;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  expr;
  AssertionFailure *in_stack_ffffffffffffffe0;
  
  if (in_RDI.super_ExprBase.impl_ != (Impl *)0x0) {
    k = Impl::kind((Impl *)in_RDI.super_ExprBase.impl_);
    bVar1 = Is<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
                      (k);
    if (!bVar1) {
      message = (char *)__cxa_allocate_exception(0x10);
      AssertionFailure::AssertionFailure(in_stack_ffffffffffffffe0,message);
      __cxa_throw(message,&AssertionFailure::typeinfo,AssertionFailure::~AssertionFailure);
    }
  }
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  ::BasicIteratedExpr((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                       *)0x199dd2);
  return (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
          )(Impl *)in_RDI.super_ExprBase.impl_;
}

Assistant:

static TargetExpr Create(const ExprBase::Impl *impl) {
    MP_ASSERT((!impl || internal::Is<TargetExpr>(impl->kind())),
              "invalid expression kind");
    TargetExpr expr;
    expr.impl_ = impl;
    return expr;
  }